

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O1

void idx2::PrintStatistics(brick_pool *Bp)

{
  idx2_file *piVar1;
  unsigned_long *puVar2;
  bucket_status *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  unsigned_long *puVar9;
  i64 Count [16];
  long local_a8 [17];
  
  piVar1 = Bp->Idx2;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  lVar8 = (Bp->BrickTable).LogCapacity;
  lVar4 = 1L << ((byte)lVar8 & 0x3f);
  lVar6 = lVar4;
  if (lVar8 != 0x3f) {
    lVar5 = 0;
    lVar8 = 0;
    if (0 < lVar4) {
      lVar8 = lVar4;
    }
    do {
      lVar6 = lVar5;
      if ((Bp->BrickTable).Stats[lVar5] == Occupied) break;
      lVar5 = lVar5 + 1;
      lVar6 = lVar4;
    } while (lVar8 + 1 != lVar5);
  }
  if (lVar6 != lVar4) {
    puVar2 = (Bp->BrickTable).Keys;
    puVar9 = (Bp->BrickTable).Keys + lVar6;
    pbVar3 = (Bp->BrickTable).Stats;
    do {
      local_a8[(uint)*puVar9 & 0xf] = local_a8[(uint)*puVar9 & 0xf] + 1;
      puVar9 = puVar2 + lVar6;
      do {
        puVar9 = puVar9 + 1;
        lVar8 = lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (pbVar3[lVar8] != Occupied);
    } while (lVar4 != lVar6);
  }
  if (piVar1->NLevels != '\0') {
    uVar7 = 0;
    do {
      if (uVar7 == 0x10) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      printf("level %d: %lld out of %lld bricks significant (%f percent)\n",uVar7 & 0xffffffff);
      uVar7 = uVar7 + 1;
    } while (uVar7 != (byte)piVar1->NLevels);
  }
  return;
}

Assistant:

void
PrintStatistics(const brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  i64 Count[idx2_file::MaxLevels] = {};

  idx2_ForEach (BIt, Bp->BrickTable)
  {
    i8 Level = GetLevelFromBrickKey(*BIt.Key);
    ++Count[Level];
  }
  idx2_For (i8, L, 0, Idx2->NLevels)
  {
    i64 NBricks = Prod<i64>(Idx2->NBricks3[L]);
    f64 Percent = f64(Count[L]) * 100 / f64(NBricks);
    printf("level %d: %lld out of %lld bricks significant (%f percent)\n", L, Count[L], NBricks, Percent);
  }
}